

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

int sptk::world::cfttree(int n,int j,int k,double *a,int nw,double *w)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)n;
  if ((k & 3U) == 0) {
    do {
      uVar2 = (int)uVar4 * 4;
      uVar4 = (ulong)uVar2;
      uVar1 = k >> 2;
      uVar3 = k & 0xc;
      k = uVar1;
    } while (uVar3 == 0);
    uVar1 = uVar1 & 1;
    if (uVar1 == 0) {
      if (0x80 < (int)uVar2) {
        do {
          uVar3 = (uint)uVar4;
          cftmdl2(uVar3,a + (int)(j - uVar3),w + (int)(nw - uVar3));
          uVar2 = uVar2 >> 2;
          uVar4 = (ulong)uVar2;
        } while (0x203 < uVar3);
      }
    }
    else if (0x80 < (int)uVar2) {
      do {
        uVar3 = (uint)uVar4;
        cftmdl1(uVar3,a + (int)(j - uVar3),w + (nw - (int)(uVar4 >> 1)));
        uVar2 = uVar2 >> 2;
        uVar4 = (ulong)uVar2;
      } while (0x203 < uVar3);
    }
  }
  else if ((k & 1U) == 0) {
    cftmdl2(n,a + (j - n),w + (nw - n));
    uVar1 = 0;
  }
  else {
    cftmdl1(n,a + (j - n),w + (nw - (n >> 1)));
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int cfttree(int n, int j, int k, double *a, int nw, double *w) {
#if 0
  void cftmdl1(int n, double *a, double *w);
  void cftmdl2(int n, double *a, double *w);
#endif
  int i, isplt, m;

  if ((k & 3) != 0) {
    isplt = k & 1;
    if (isplt != 0) {
      cftmdl1(n, &a[j - n], &w[nw - (n >> 1)]);
    } else {
      cftmdl2(n, &a[j - n], &w[nw - n]);
    }
  } else {
    m = n;
    for (i = k; (i & 3) == 0; i >>= 2) {
      m <<= 2;
    }
    isplt = i & 1;
    if (isplt != 0) {
      while (m > 128) {
        cftmdl1(m, &a[j - m], &w[nw - (m >> 1)]);
        m >>= 2;
      }
    } else {
      while (m > 128) {
        cftmdl2(m, &a[j - m], &w[nw - m]);
        m >>= 2;
      }
    }
  }
  return isplt;
}